

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_>::addStorage
          (Span<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *this)

{
  byte bVar1;
  Entry *__dest;
  uchar *puVar2;
  ulong uVar3;
  ulong uStack_30;
  
  bVar1 = this->allocated;
  uVar3 = (ulong)bVar1;
  if (bVar1 == 0) {
    uStack_30 = 0x30;
  }
  else if (bVar1 == 0x30) {
    uStack_30 = 0x50;
  }
  else {
    uStack_30 = uVar3 + 0x10;
  }
  __dest = (Entry *)operator_new__((ulong)(uint)((int)uStack_30 << 5));
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    memcpy(__dest,this->entries,(ulong)bVar1 << 5);
  }
  puVar2 = (__dest->storage).data + (uint)((int)uVar3 << 5);
  while (uVar3 < uStack_30) {
    uVar3 = uVar3 + 1;
    *puVar2 = (uchar)uVar3;
    puVar2 = puVar2 + 0x20;
  }
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = __dest;
  this->allocated = (uchar)uStack_30;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }